

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cryptohelper_test.cpp
# Opt level: O2

void __thiscall test::test_load_and_sign::test_method(test_load_and_sign *this)

{
  long *local_100;
  allocator local_f8 [8];
  undefined8 local_f0;
  shared_count sStack_e8;
  undefined **local_e0;
  undefined1 local_d8;
  undefined1 *local_d0;
  char *local_c8;
  string signature;
  string pk_str;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  char *local_30;
  char *local_28;
  
  license::CryptoHelper::getInstance();
  loadPrivateKey_abi_cxx11_();
  (**(code **)(*local_100 + 0x20))(local_100,&pk_str);
  std::__cxx11::string::string((string *)&local_e0,"testString",local_f8);
  (**(code **)(*local_100 + 0x28))(&signature,local_100,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  local_30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/cryptohelper_test.cpp"
  ;
  local_28 = "";
  local_40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_38 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_30,0x65);
  local_f8[0] = (allocator)(signature._M_string_length == 0xac);
  local_f0 = 0;
  sStack_e8.pi_ = (sp_counted_base *)0x0;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_00541db0;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = "signature is the right size";
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/cryptohelper_test.cpp"
  ;
  local_48 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_e8);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/cryptohelper_test.cpp"
  ;
  local_58 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x66);
  local_f8[0] = (allocator)
                std::operator==(&signature,
                                "0pBQSdgwE6amOQJ1T+byZhJetVl86OWLHC+ICJ/IENVoNqcJF2pDaoRuNtDEq5v/lqmQbQJg4d08VtRCen3Q3VuUrge2e7hQ3ktkkK8DwTtUJA+pcB540sofcdbXabF+L+vwmj5jUWsamJzp/fhg8xpQ72L54UzjcbKsGVgsc2Y="
                               );
  local_f0 = 0;
  sStack_e8.pi_ = (sp_counted_base *)0x0;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_00541e70;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = "signature is repeatable";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_e8);
  std::__cxx11::string::~string((string *)&signature);
  std::__cxx11::string::~string((string *)&pk_str);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_load_and_sign) {
	unique_ptr<CryptoHelper> crypto(CryptoHelper::getInstance());
	const std::string pk_str = loadPrivateKey();
	crypto->loadPrivateKey(pk_str);
	const std::string signature = crypto->signString("testString");
	BOOST_CHECK_MESSAGE(signature.size() == 172, "signature is the right size");
	BOOST_CHECK_MESSAGE(signature == SIGNATURE, "signature is repeatable");
	crypto.release();
}